

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualMemory.c
# Opt level: O0

_Bool sysbvm_virtualMemory_lockCodePagesForWriting
                (void *writePointer,void *executablePointer,size_t size)

{
  int iVar1;
  size_t sVar2;
  _Bool success;
  uintptr_t endAddress;
  uintptr_t startAddress;
  size_t pageAlignment;
  size_t size_local;
  void *executablePointer_local;
  void *writePointer_local;
  
  if (writePointer == executablePointer) {
    sVar2 = sysbvm_virtualMemory_getSystemAllocationAlignment();
    pthread_mutex_lock((pthread_mutex_t *)&codeZoneWriteLock);
    iVar1 = mprotect((void *)((ulong)executablePointer & -sVar2),
                     ((long)executablePointer + sVar2 + size + -1 & -sVar2) -
                     (long)((ulong)executablePointer & -sVar2),7);
    writePointer_local._7_1_ = iVar1 == 0;
    if (!writePointer_local._7_1_) {
      pthread_mutex_unlock((pthread_mutex_t *)&codeZoneWriteLock);
    }
  }
  else {
    writePointer_local._7_1_ = true;
  }
  return writePointer_local._7_1_;
}

Assistant:

bool sysbvm_virtualMemory_lockCodePagesForWriting(void *writePointer, void *executablePointer, size_t size)
{
    if(writePointer != executablePointer)
        return true;

    size_t pageAlignment = sysbvm_virtualMemory_getSystemAllocationAlignment();
    uintptr_t startAddress = (uintptr_t)executablePointer & (-pageAlignment);
    uintptr_t endAddress = ((uintptr_t)executablePointer + size + pageAlignment - 1) & (-pageAlignment);

    pthread_mutex_lock(&codeZoneWriteLock);
    bool success = mprotect((void*)startAddress, endAddress - startAddress, PROT_READ | PROT_WRITE | PROT_EXEC) == 0;
    if(!success)
        pthread_mutex_unlock(&codeZoneWriteLock);

    return success;
}